

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O2

FatalException *
duckdb::ErrorManager::InvalidatedDatabase
          (FatalException *__return_storage_ptr__,ClientContext *context,string *invalidated_msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string sStack_58;
  string local_38 [32];
  
  ::std::__cxx11::string::string(local_38,(string *)invalidated_msg);
  FormatException<std::__cxx11::string>
            (&sStack_58,(ErrorManager *)context,(ClientContext *)0x2,(ErrorType)local_38,in_R8);
  FatalException::FatalException(__return_storage_ptr__,(string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

FatalException ErrorManager::InvalidatedDatabase(ClientContext &context, const string &invalidated_msg) {
	return FatalException(ErrorManager::FormatException(context, ErrorType::INVALIDATED_DATABASE, invalidated_msg));
}